

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_event_wake_pipe.c
# Opt level: O2

ares_event_t * ares_pipeevent_create(ares_event_thread_t *e)

{
  int iVar1;
  ares_status_t aVar2;
  ares_pipeevent_t *p;
  ares_event_t *event;
  
  event = (ares_event_t *)0x0;
  p = (ares_pipeevent_t *)ares_malloc_zero(8);
  if (p != (ares_pipeevent_t *)0x0) {
    *(undefined8 *)p->filedes = 0xffffffffffffffff;
    iVar1 = pipe2((int *)p,0x80800);
    if ((iVar1 == 0) &&
       (aVar2 = ares_event_update(&event,e,ARES_EVENT_FLAG_READ,ares_pipeevent_cb,p->filedes[0],p,
                                  ares_pipeevent_destroy_cb,ares_pipeevent_signal),
       aVar2 == ARES_SUCCESS)) {
      return event;
    }
    ares_pipeevent_destroy(p);
  }
  return (ares_event_t *)0x0;
}

Assistant:

ares_event_t *ares_pipeevent_create(ares_event_thread_t *e)
{
  ares_event_t     *event = NULL;
  ares_pipeevent_t *p     = NULL;
  ares_status_t     status;

  p = ares_pipeevent_init();
  if (p == NULL) {
    return NULL;
  }

  status = ares_event_update(&event, e, ARES_EVENT_FLAG_READ, ares_pipeevent_cb,
                             p->filedes[0], p, ares_pipeevent_destroy_cb,
                             ares_pipeevent_signal);
  if (status != ARES_SUCCESS) {
    ares_pipeevent_destroy(p); /* LCOV_EXCL_LINE: DefensiveCoding */
    return NULL;               /* LCOV_EXCL_LINE: DefensiveCoding */
  }

  return event;
}